

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O2

int phr_parse_request(char *buf_start,size_t len,char **method,size_t *method_len,char **path,
                     size_t *path_len,int *minor_version,phr_header *headers,size_t *num_headers,
                     size_t last_len)

{
  byte *buf_end;
  char *pcVar1;
  byte *pbVar2;
  byte *pbVar3;
  long lVar4;
  size_t sVar5;
  byte bVar6;
  int r;
  int local_44;
  size_t local_40;
  size_t *local_38;
  
  local_40 = *num_headers;
  *method = (char *)0x0;
  *method_len = 0;
  *path = (char *)0x0;
  *path_len = 0;
  buf_end = (byte *)(buf_start + len);
  *minor_version = -1;
  *num_headers = 0;
  local_38 = method_len;
  if ((last_len != 0) &&
     (pcVar1 = is_complete(buf_start,(char *)buf_end,last_len,&local_44), pcVar1 == (char *)0x0)) {
    return local_44;
  }
  if (len != 0) {
    if (*buf_start == '\n') {
      pbVar2 = (byte *)(buf_start + 1);
    }
    else {
      pbVar2 = (byte *)buf_start;
      if (*buf_start == '\r') {
        if (len == 1) {
          return -2;
        }
        if (buf_start[1] != '\n') {
          return -1;
        }
        pbVar2 = (byte *)(buf_start + 2);
      }
    }
    if (pbVar2 != buf_end) {
      sVar5 = 0;
      do {
        bVar6 = pbVar2[sVar5];
        if (bVar6 == 0x20) {
          *method = (char *)pbVar2;
          *local_38 = sVar5;
          pbVar2 = pbVar2 + sVar5 + 1;
          do {
            pbVar3 = pbVar2;
            if (pbVar3 == buf_end) {
              return -2;
            }
            bVar6 = *pbVar3;
            pbVar2 = pbVar3 + 1;
          } while (bVar6 == 0x20);
          lVar4 = 0;
          while (bVar6 != 0x20) {
            if (bVar6 - 0x7f < 0xffffffa1) {
              if (bVar6 < 0x20) {
                return -1;
              }
              if (bVar6 == 0x7f) {
                return -1;
              }
            }
            if (pbVar2 == buf_end) {
              return -2;
            }
            lVar4 = lVar4 + -1;
            bVar6 = *pbVar2;
            pbVar2 = pbVar2 + 1;
          }
          *path = (char *)pbVar3;
          *path_len = -lVar4;
          do {
            pbVar3 = pbVar2;
            if (pbVar3 == buf_end) {
              return -2;
            }
            pbVar2 = pbVar3 + 1;
          } while (*pbVar3 == 0x20);
          if ((lVar4 != 0) && (*local_38 != 0)) {
            pcVar1 = parse_http_version((char *)pbVar3,(char *)buf_end,minor_version,&local_44);
            if (pcVar1 == (char *)0x0) {
              return local_44;
            }
            if (*pcVar1 == '\n') {
              pcVar1 = pcVar1 + 1;
LAB_00106625:
              pcVar1 = parse_headers(pcVar1,(char *)buf_end,headers,num_headers,local_40,&local_44);
              if (pcVar1 != (char *)0x0) {
                return (int)pcVar1 - (int)buf_start;
              }
              return local_44;
            }
            if (*pcVar1 == '\r') {
              if ((byte *)(pcVar1 + 1) == buf_end) {
                return -2;
              }
              if (pcVar1[1] == '\n') {
                pcVar1 = pcVar1 + 2;
                goto LAB_00106625;
              }
            }
          }
          return -1;
        }
        if (bVar6 - 0x7f < 0xffffffa1) {
          if (bVar6 < 0x20) {
            return -1;
          }
          if (bVar6 == 0x7f) {
            return -1;
          }
        }
        lVar4 = sVar5 + 1;
        sVar5 = sVar5 + 1;
      } while (pbVar2 + lVar4 != buf_end);
    }
  }
  return -2;
}

Assistant:

int phr_parse_request(const char *buf_start, size_t len, const char **method, size_t *method_len, const char **path,
                      size_t *path_len, int *minor_version, struct phr_header *headers, size_t *num_headers, size_t last_len)
{
    const char *buf = buf_start, *buf_end = buf_start + len;
    size_t max_headers = *num_headers;
    int r;

    *method = NULL;
    *method_len = 0;
    *path = NULL;
    *path_len = 0;
    *minor_version = -1;
    *num_headers = 0;

    /* if last_len != 0, check if the request is complete (a fast countermeasure
       againt slowloris */
    if (last_len != 0 && is_complete(buf, buf_end, last_len, &r) == NULL) {
        return r;
    }

    if ((buf = parse_request(buf, buf_end, method, method_len, path, path_len, minor_version, headers, num_headers, max_headers,
                             &r)) == NULL) {
        return r;
    }

    return (int)(buf - buf_start);
}